

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter)

{
  int iVar1;
  Fts5Index *p;
  u8 *puVar2;
  void *p_00;
  long lVar3;
  
  p = (Fts5Index *)pIndexIter[1].pData;
  fts5MultiIterNext(p,(Fts5Iter *)pIndexIter,0,0);
  if (p->rc == 0) {
    lVar3 = (ulong)*(ushort *)(pIndexIter[4].iRowid + 4) * 0x80;
    p_00 = *(void **)((long)pIndexIter + lVar3 + 0x78);
    if ((p_00 != (void *)0x0) && (**(char **)((long)pIndexIter + lVar3 + 200) != '0')) {
      sqlite3_free(p_00);
      *(undefined8 *)((long)pIndexIter + lVar3 + 0x78) = 0;
      pIndexIter->bEof = '\x01';
    }
  }
  puVar2 = pIndexIter[1].pData;
  iVar1 = *(int *)(puVar2 + 0x3c);
  puVar2[0x3c] = '\0';
  puVar2[0x3d] = '\0';
  puVar2[0x3e] = '\0';
  puVar2[0x3f] = '\0';
  return iVar1;
}

Assistant:

static int sqlite3Fts5IterNextScan(Fts5IndexIter *pIndexIter){
  Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
  Fts5Index *p = pIter->pIndex;

  assert( pIter->pIndex->rc==SQLITE_OK );

  fts5MultiIterNext(p, pIter, 0, 0);
  if( p->rc==SQLITE_OK ){
    Fts5SegIter *pSeg = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    if( pSeg->pLeaf && pSeg->term.p[0]!=FTS5_MAIN_PREFIX ){
      fts5DataRelease(pSeg->pLeaf);
      pSeg->pLeaf = 0;
      pIter->base.bEof = 1;
    }
  }

  return fts5IndexReturn(pIter->pIndex);
}